

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_udp.c
# Opt level: O0

int nni_plat_udp_multicast_membership(nni_plat_udp *udp,nni_sockaddr *sa,_Bool join)

{
  size_t sVar1;
  int local_b0;
  int rv;
  socklen_t sz;
  sockaddr_storage ss;
  _Bool join_local;
  nni_sockaddr *sa_local;
  nni_plat_udp *udp_local;
  
  ss.__ss_align._7_1_ = join;
  sVar1 = nni_posix_nn2sockaddr(&rv,sa);
  if ((int)sVar1 == 0) {
    udp_local._4_4_ = 0xf;
  }
  else {
    if ((short)rv == 2) {
      local_b0 = ip4_multicast_member(udp,(sockaddr *)&rv,(_Bool)(ss.__ss_align._7_1_ & 1));
    }
    else if ((short)rv == 10) {
      local_b0 = ip6_multicast_member(udp,(sockaddr *)&rv,(_Bool)(ss.__ss_align._7_1_ & 1));
    }
    else {
      local_b0 = 0xf;
    }
    udp_local._4_4_ = local_b0;
  }
  return udp_local._4_4_;
}

Assistant:

int
nni_plat_udp_multicast_membership(
    nni_plat_udp *udp, nni_sockaddr *sa, bool join)
{
	struct sockaddr_storage ss;
	socklen_t               sz;
	int                     rv;

	sz = nni_posix_nn2sockaddr(&ss, sa);
	if (sz < 1) {
		return (NNG_EADDRINVAL);
	}
	switch (ss.ss_family) {
	case AF_INET:
		rv = ip4_multicast_member(udp, (struct sockaddr *) &ss, join);
		break;
#ifdef NNG_ENABLE_IPV6
	case AF_INET6:
		rv = ip6_multicast_member(udp, (struct sockaddr *) &ss, join);
		break;
#endif
	default:
		rv = NNG_EADDRINVAL;
	}

	return (rv);
}